

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false>::
visit<slang::ast::ConcurrentAssertionStatement>
          (ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false> *this,
          ConcurrentAssertionStatement *t)

{
  bool bVar1;
  Statement *in_RSI;
  ConcurrentAssertionStatement *in_stack_00000048;
  CheckerMemberVisitor *in_stack_00000050;
  
  bVar1 = Statement::bad(in_RSI);
  if (!bVar1) {
    CheckerMemberVisitor::handle<slang::ast::ConcurrentAssertionStatement>
              (in_stack_00000050,in_stack_00000048);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }